

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<10,_2,_13,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int i_3;
  undefined8 *puVar3;
  long lVar4;
  int row;
  long lVar5;
  int i;
  long lVar6;
  int row_1;
  undefined4 uVar7;
  Vector<float,_3> res_3;
  Vector<float,_3> res_4;
  Vector<float,_3> res_5;
  Vector<float,_3> res_2;
  Mat4 m;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  float afStack_160 [2];
  undefined8 local_158;
  undefined4 local_150;
  float local_148 [4];
  undefined8 local_138;
  float local_130;
  undefined8 local_128;
  ulong local_120;
  undefined4 local_118;
  float local_110 [4];
  float local_100 [4];
  float local_f0 [6];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Matrix<float,_4,_4> local_98;
  undefined8 local_58;
  ulong uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  puVar3 = &local_d8;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar4 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)puVar3 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    lVar5 = lVar5 + 1;
    puVar3 = (undefined8 *)((long)puVar3 + 4);
    lVar4 = lVar4 + 0x10;
  } while (lVar5 != 4);
  local_d8 = *(undefined8 *)evalCtx->in[0].m_data;
  uStack_d0 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
  uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
  uVar2 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  local_c8 = (undefined4)uVar1;
  uStack_c4 = (undefined4)((ulong)uVar1 >> 0x20);
  uStack_c0 = (undefined4)uVar2;
  uStack_bc = (undefined4)((ulong)uVar2 >> 0x20);
  local_b8 = *(undefined8 *)evalCtx->in[2].m_data;
  uStack_b0 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  local_a8 = *(undefined8 *)evalCtx->in[3].m_data;
  uVar1 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  local_128 = local_d8;
  local_120 = CONCAT44(local_120._4_4_,(undefined4)uStack_d0);
  local_158 = CONCAT44(uStack_c0,uStack_c4);
  local_150 = uStack_bc;
  local_58 = 0;
  uStack_50 = uStack_50 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(float *)((long)&local_58 + lVar4 * 4) =
         *(float *)((long)&local_128 + lVar4 * 4) + *(float *)((long)&local_158 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_138 = uStack_b0;
  local_130 = (float)(undefined4)local_b8;
  local_98.m_data.m_data[0].m_data[0] = 0.0;
  local_98.m_data.m_data[0].m_data[1] = 0.0;
  local_98.m_data.m_data[0].m_data[2] = 0.0;
  lVar4 = 0;
  do {
    local_98.m_data.m_data[0].m_data[lVar4] =
         *(float *)((long)&local_58 + lVar4 * 4) + *(float *)((long)&local_138 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  uStack_a0._4_4_ = (float)((ulong)uVar1 >> 0x20);
  local_148[0] = uStack_a0._4_4_;
  local_148[1] = (float)local_a8;
  local_148[2] = (float)((ulong)local_a8 >> 0x20);
  local_100[0] = 0.0;
  local_100[1] = 0.0;
  local_100[2] = 0.0;
  lVar4 = 0;
  do {
    local_100[lVar4] = local_98.m_data.m_data[0].m_data[lVar4] + local_148[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  puVar3 = &local_58;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar4 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)puVar3 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    lVar5 = lVar5 + 1;
    puVar3 = (undefined8 *)((long)puVar3 + 4);
    lVar4 = lVar4 + 0x10;
  } while (lVar5 != 4);
  local_58 = *(undefined8 *)evalCtx->in[0].m_data;
  uStack_50 = *(ulong *)(evalCtx->in[0].m_data + 2);
  local_48 = *(undefined8 *)evalCtx->in[1].m_data;
  uStack_40 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  local_38 = *(undefined8 *)
              ((Vector<tcu::Vector<float,_4>,_4> *)evalCtx->in[2].m_data)->m_data[0].m_data;
  uStack_30 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  local_28 = *(undefined8 *)evalCtx->in[3].m_data;
  uStack_20 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  afStack_160[0] = 4.421077e-39;
  afStack_160[1] = 0.0;
  uStack_a0 = uVar1;
  decrement<float,4,4>
            (&local_98,(MatrixCaseUtils *)&local_58,(Matrix<float,_4,_4> *)(evalCtx->in + 2));
  local_138._0_4_ = local_98.m_data.m_data[0].m_data[0];
  local_138._4_4_ = local_98.m_data.m_data[0].m_data[1];
  local_130 = local_98.m_data.m_data[0].m_data[2];
  local_148[0] = local_98.m_data.m_data[1].m_data[1];
  local_148[1] = local_98.m_data.m_data[1].m_data[2];
  local_148[2] = local_98.m_data.m_data[1].m_data[3];
  local_158 = 0;
  local_150 = 0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_158 + lVar4 * 4) =
         *(float *)((long)&local_138 + lVar4 * 4) + local_148[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_f0[0] = local_98.m_data.m_data[2].m_data[2];
  local_f0[1] = local_98.m_data.m_data[2].m_data[3];
  local_f0[2] = local_98.m_data.m_data[2].m_data[0];
  local_128 = 0;
  local_120 = local_120 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(float *)((long)&local_128 + lVar4 * 4) =
         *(float *)((long)&local_158 + lVar4 * 4) + local_f0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_f0[3] = local_98.m_data.m_data[3].m_data[3];
  local_f0[4] = local_98.m_data.m_data[3].m_data[0];
  local_f0[5] = local_98.m_data.m_data[3].m_data[1];
  local_110[0] = 0.0;
  local_110[1] = 0.0;
  local_110[2] = 0.0;
  lVar4 = 0;
  do {
    local_110[lVar4] = *(float *)((long)&local_128 + lVar4 * 4) + local_f0[lVar4 + 3];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_158 = 0;
  local_150 = 0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_158 + lVar4 * 4) = local_100[lVar4] + local_110[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_120 = 0x100000000;
  local_118 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_128 + lVar4 * 4)] = afStack_160[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}